

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O0

int tool_debug_cb(CURL *handle,curl_infotype type,char *data,size_t size,void *userdata)

{
  GlobalConfig *config_00;
  int iVar1;
  time_t tVar2;
  tm *ptVar3;
  FILE *pFVar4;
  timeval tVar5;
  ulong local_b8;
  size_t i;
  size_t st;
  __suseconds_t local_a0;
  tm *now;
  time_t secs;
  char timebuf [20];
  timeval tv;
  char *text;
  FILE *output;
  GlobalConfig *config;
  OperationConfig *operation;
  void *userdata_local;
  size_t size_local;
  char *data_local;
  curl_infotype type_local;
  CURL *handle_local;
  
  config_00 = *(GlobalConfig **)((long)userdata + 0x488);
  text = (char *)config_00->errors;
  if ((config_00->tracetime & 1U) == 0) {
    secs._0_1_ = 0;
  }
  else {
    tVar5 = tvnow();
    st = tVar5.tv_sec;
    local_a0 = tVar5.tv_usec;
    if (tool_debug_cb::known_offset == 0) {
      tVar2 = time((time_t *)0x0);
      tool_debug_cb::epoch_offset = tVar2 - st;
      tool_debug_cb::known_offset = 1;
    }
    now = (tm *)(tool_debug_cb::epoch_offset + st);
    ptVar3 = localtime((time_t *)&now);
    curl_msnprintf(&secs,0x14,"%02d:%02d:%02d.%06ld ",ptVar3->tm_hour,ptVar3->tm_min,ptVar3->tm_sec,
                   local_a0);
  }
  if (config_00->trace_stream == (FILE *)0x0) {
    iVar1 = strcmp("-",config_00->trace_dump);
    if (iVar1 == 0) {
      config_00->trace_stream = _stdout;
    }
    else {
      iVar1 = strcmp("%",config_00->trace_dump);
      if (iVar1 == 0) {
        config_00->trace_stream = config_00->errors;
      }
      else {
        pFVar4 = fopen64(config_00->trace_dump,"w");
        config_00->trace_stream = (FILE *)pFVar4;
        config_00->trace_fopened = true;
      }
    }
  }
  if (config_00->trace_stream != (FILE *)0x0) {
    text = (char *)config_00->trace_stream;
  }
  if (text == (char *)0x0) {
    warnf(config_00,"Failed to create/open output");
    return 0;
  }
  if (config_00->tracetype == TRACE_PLAIN) {
    if (type < CURLINFO_HEADER_OUT) {
      if ((tool_debug_cb::newl & 1U) == 0) {
        curl_mfprintf(text,"%s%s ",&secs,tool_debug_cb::s_infotype[type]);
      }
      fwrite(data,size,1,(FILE *)text);
      tool_debug_cb::newl = false;
      if (size != 0) {
        tool_debug_cb::newl = data[size - 1] != '\n';
      }
      tool_debug_cb::traced_data = false;
      return 0;
    }
    if (type == CURLINFO_HEADER_OUT) {
      if (size != 0) {
        i = 0;
        for (local_b8 = 0; local_b8 < size - 1; local_b8 = local_b8 + 1) {
          if (data[local_b8] == '\n') {
            if ((tool_debug_cb::newl & 1U) == 0) {
              curl_mfprintf(text,"%s%s ",&secs,">");
            }
            fwrite(data + i,(local_b8 - i) + 1,1,(FILE *)text);
            i = local_b8 + 1;
            tool_debug_cb::newl = false;
          }
        }
        if ((tool_debug_cb::newl & 1U) == 0) {
          curl_mfprintf(text,"%s%s ",&secs,">");
        }
        fwrite(data + i,(local_b8 - i) + 1,1,(FILE *)text);
      }
      tool_debug_cb::newl = false;
      if (size != 0) {
        tool_debug_cb::newl = data[size - 1] != '\n';
      }
      tool_debug_cb::traced_data = false;
      return 0;
    }
    if (3 < type - CURLINFO_DATA_IN) {
      tool_debug_cb::newl = false;
      tool_debug_cb::traced_data = false;
      return 0;
    }
    if ((tool_debug_cb::traced_data & 1U) != 0) {
      return 0;
    }
    if ((config_00->isatty & 1U) != 0) {
      if (text == _stderr) {
        return 0;
      }
      if ((FILE *)text == _stdout) {
        return 0;
      }
    }
    if ((tool_debug_cb::newl & 1U) == 0) {
      curl_mfprintf(text,"%s%s ",&secs,tool_debug_cb::s_infotype[type]);
    }
    curl_mfprintf(text,"[%zu bytes data]\n",size);
    tool_debug_cb::newl = false;
    tool_debug_cb::traced_data = true;
    return 0;
  }
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(text,"%s== Info: %s",&secs,data);
    return 0;
  case CURLINFO_HEADER_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_31f;
    break;
  case CURLINFO_HEADER_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_2f3;
    break;
  case CURLINFO_DATA_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_329;
    break;
  case CURLINFO_DATA_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_309;
    break;
  case CURLINFO_SSL_DATA_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_333;
    break;
  case CURLINFO_SSL_DATA_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_349;
    break;
  default:
    goto switchD_0010bdfd_default;
  }
  dump((char *)&secs,(char *)tv.tv_usec,(FILE *)text,(uchar *)data,size,config_00->tracetype,type);
switchD_0010bdfd_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = config->errors;
  const char *text;
  struct timeval tv;
  char timebuf[20];
  time_t secs;

  (void)handle; /* not used */

  if(config->tracetime) {
    struct tm *now;
    static time_t epoch_offset;
    static int    known_offset;
    tv = tvnow();
    if(!known_offset) {
      epoch_offset = time(NULL) - tv.tv_sec;
      known_offset = 1;
    }
    secs = epoch_offset + tv.tv_sec;
    now = localtime(&secs);  /* not thread safe but we don't care */
    snprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld ",
             now->tm_hour, now->tm_min, now->tm_sec, (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(!strcmp("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(!strcmp("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = config->errors;  /* aka stderr */
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    /*
     * This is the trace look that is similar to what libcurl makes on its
     * own.
     */
    static const char * const s_infotype[] = {
      "*", "<", ">", "{", "}", "{", "}"
    };
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        size_t st = 0;
        size_t i;
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              fprintf(output, "%s%s ", timebuf, s_infotype[type]);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          fprintf(output, "%s%s ", timebuf, s_infotype[type]);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        fprintf(output, "%s%s ", timebuf, s_infotype[type]);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we're sending this debug trace
           to stderr or stdout, we don't display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty || ((output != stderr) && (output != stdout))) {
          if(!newl)
            fprintf(output, "%s%s ", timebuf, s_infotype[type]);
          fprintf(output, "[%zu bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

#ifdef CURL_DOES_CONVERSIONS
  /* Special processing is needed for CURLINFO_HEADER_OUT blocks
   * if they contain both headers and data (separated by CRLFCRLF).
   * We dump the header text and then switch type to CURLINFO_DATA_OUT.
   */
  if((type == CURLINFO_HEADER_OUT) && (size > 4)) {
    size_t i;
    for(i = 0; i < size - 4; i++) {
      if(memcmp(&data[i], "\r\n\r\n", 4) == 0) {
        /* dump everything through the CRLFCRLF as a sent header */
        text = "=> Send header";
        dump(timebuf, text, output, (unsigned char *)data, i + 4,
             config->tracetype, type);
        data += i + 3;
        size -= i + 4;
        type = CURLINFO_DATA_OUT;
        data += 1;
        break;
      }
    }
  }
#endif /* CURL_DOES_CONVERSIONS */

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s== Info: %s", timebuf, data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, text, output, (unsigned char *) data, size, config->tracetype,
       type);
  return 0;
}